

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O3

void mpc_sbox_verify_s128_256
               (mzd_local_t *out,mzd_local_t *in,view_t *view,rvec_t *rvec,mzd_local_t *mask_a,
               mzd_local_t *mask_b,mzd_local_t *mask_c)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [16];
  bool bVar7;
  undefined1 (*pauVar8) [16];
  long lVar9;
  undefined1 (*pauVar10) [16];
  undefined1 (*pauVar11) [16];
  undefined1 (*pauVar12) [16];
  longlong *plVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar21 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  word128 x2m [2] [2];
  word128 x1s [2] [2];
  word128 x0s [2] [2];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 auStack_78 [8];
  word128 r1s [2] [2];
  
  auVar19 = *(undefined1 (*) [16])mask_a->w64;
  auVar20 = *(undefined1 (*) [16])(mask_a->w64 + 2);
  plVar13 = (longlong *)auStack_78;
  pauVar6 = &local_b8;
  pauVar10 = &local_f8;
  pauVar5 = &local_138;
  pauVar4 = &local_178;
  pauVar8 = &local_1b8;
  lVar9 = 0;
  pauVar11 = &local_1f8;
  pauVar12 = &local_238;
  bVar3 = true;
  do {
    bVar7 = bVar3;
    auVar23 = *(undefined1 (*) [16])in[lVar9].w64;
    auVar25 = *(undefined1 (*) [16])(in[lVar9].w64 + 2);
    auVar24 = vandpd_avx(auVar23,in_ZMM0._0_16_);
    auVar22 = vandpd_avx(auVar23,in_ZMM2._0_16_);
    auVar23 = vandpd_avx(auVar23,auVar19);
    auVar21 = vandpd_avx(auVar25,in_ZMM1._0_16_);
    auVar26 = vandpd_avx(auVar25,in_ZMM3._0_16_);
    *pauVar8 = auVar23;
    auVar23 = vandpd_avx(auVar25,auVar20);
    auVar25 = vpslldq_avx(auVar24,8);
    auVar25 = vpshldq_avx512_vbmi2(auVar24,auVar25,2);
    pauVar8[1] = auVar23;
    auVar23 = vpsrldq_avx(auVar24,8);
    pauVar8 = &local_198;
    auVar24 = vpsrlq_avx(auVar23,0x3e);
    *pauVar5 = auVar25;
    auVar23 = vpslldq_avx(auVar21,8);
    auVar23 = vpshldq_avx512_vbmi2(auVar21,auVar23,2);
    auVar23 = vpor_avx(auVar23,auVar24);
    auVar25 = vpslldq_avx(auVar22,8);
    auVar25 = vpshldq_avx512_vbmi2(auVar22,auVar25,1);
    pauVar5[1] = auVar23;
    auVar23 = vpsrldq_avx(auVar22,8);
    pauVar5 = &local_118;
    auVar24 = vpsrlq_avx(auVar23,0x3f);
    *pauVar4 = auVar25;
    auVar23 = vpslldq_avx(auVar26,8);
    auVar23 = vpshldq_avx512_vbmi2(auVar26,auVar23,1);
    auVar23 = vpor_avx(auVar23,auVar24);
    pauVar4[1] = auVar23;
    pauVar4 = &local_158;
    auVar23 = *(undefined1 (*) [16])((long)rvec + lVar9 * 0x20);
    auVar25 = *(undefined1 (*) [16])((long)rvec + lVar9 * 0x20 + 0x10);
    lVar9 = 1;
    auVar24 = vandpd_avx(auVar23,in_ZMM0._0_16_);
    auVar22 = vandpd_avx(auVar23,in_ZMM2._0_16_);
    auVar23 = vandpd_avx(auVar23,auVar19);
    auVar21 = vandpd_avx(auVar25,in_ZMM1._0_16_);
    auVar26 = vandpd_avx(auVar25,in_ZMM3._0_16_);
    *pauVar10 = auVar23;
    auVar23 = vandpd_avx(auVar25,auVar20);
    auVar25 = vpslldq_avx(auVar24,8);
    *(undefined1 (*) [16])plVar13 = auVar24;
    *(undefined1 (*) [16])(plVar13 + 2) = auVar21;
    *pauVar6 = auVar22;
    pauVar6[1] = auVar26;
    pauVar6 = &local_98;
    plVar13 = r1s[0][1] + 1;
    auVar25 = vpshldq_avx512_vbmi2(auVar24,auVar25,2);
    pauVar10[1] = auVar23;
    auVar23 = vpsrldq_avx(auVar24,8);
    pauVar10 = &local_d8;
    auVar24 = vpsrlq_avx(auVar23,0x3e);
    *pauVar11 = auVar25;
    auVar23 = vpslldq_avx(auVar21,8);
    auVar23 = vpshldq_avx512_vbmi2(auVar21,auVar23,2);
    auVar23 = vpor_avx(auVar23,auVar24);
    auVar25 = vpslldq_avx(auVar22,8);
    auVar25 = vpshldq_avx512_vbmi2(auVar22,auVar25,1);
    pauVar11[1] = auVar23;
    auVar23 = vpsrldq_avx(auVar22,8);
    auVar24 = vpsrlq_avx(auVar23,0x3f);
    *pauVar12 = auVar25;
    auVar23 = vpslldq_avx(auVar26,8);
    auVar23 = vpshldq_avx512_vbmi2(auVar26,auVar23,1);
    auVar23 = vpor_avx(auVar23,auVar24);
    pauVar12[1] = auVar23;
    pauVar11 = &local_1d8;
    pauVar12 = &local_218;
    bVar3 = false;
  } while (bVar7);
  lVar9 = 0;
  auVar19 = vpand_avx(local_158,local_138);
  auVar20 = vpand_avx(local_148,local_128);
  auVar23 = vpand_avx(local_138 ^ local_118,local_178);
  auVar25 = vpand_avx(local_128 ^ local_108,local_168);
  _auStack_78 = vpternlogq_avx512vl(local_f8 ^ local_d8,auVar19,auVar23,0x96);
  auVar14 = vpternlogq_avx512vl(local_e8 ^ local_c8,auVar20,auVar25,0x96);
  r1s[0][0][1] = auVar14._0_8_;
  r1s[0][1][0] = auVar14._8_8_;
  *(undefined1 (*) [16])view = _auStack_78;
  *(undefined1 (*) [16])(view->t + 2) = auVar14;
  auVar19 = *(undefined1 (*) [16])(view->t + 4);
  auVar20 = *(undefined1 (*) [16])(view->t + 6);
  auVar24 = vmovdqa64_avx512vl(local_238);
  auVar15 = vmovdqa64_avx512vl(local_228);
  auVar23 = vandpd_avx(auVar19,*(undefined1 (*) [16])mask_a->w64);
  auVar25 = vandpd_avx(auVar20,*(undefined1 (*) [16])(mask_a->w64 + 2));
  auVar16 = vpxorq_avx512vl(auVar24,local_218);
  auVar24 = vpand_avx(local_198,local_138);
  auVar22 = vpand_avx(local_188,local_128);
  r1s[0][1][1] = auVar23._0_8_;
  r1s[1][0][0] = auVar23._8_8_;
  r1s[1][0][1] = auVar25._0_8_;
  r1s[1][1][0] = auVar25._8_8_;
  auVar17 = vpternlogq_avx512vl(local_158,local_1b8,local_178,0x48);
  auVar23 = vpand_avx(local_198,local_178);
  auVar18 = vpternlogq_avx512vl(local_148,local_1a8,local_168,0x48);
  auVar25 = vpand_avx(local_188,local_168);
  auVar21 = vpand_avx(local_1b8,local_138 ^ local_118);
  auVar26 = vpand_avx(local_1a8,local_128 ^ local_108);
  auVar23 = vpternlogq_avx512vl(auVar16,auVar23,auVar17,0x96);
  auVar15 = vpxorq_avx512vl(auVar15,local_208);
  auVar27 = vpsrldq_avx512vl(auVar23,8);
  local_f8 = vmovdqa64_avx512vl(auVar23);
  auVar23 = vpshldq_avx512_vbmi2(auVar27._0_16_,auVar23,0x3f);
  auVar27 = vpslldq_avx512vl(auVar20,8);
  auVar16 = vpshldq_avx512_vbmi2(auVar20,auVar27._0_16_,1);
  local_e8 = vpternlogq_avx512vl(auVar15,auVar25,auVar18,0x96);
  auVar25 = vpsrldq_avx(local_e8,8);
  auVar15 = vpslldq_avx(local_e8,8);
  auVar25 = vpshldq_avx512_vbmi2(auVar25,local_e8,0x3f);
  auVar15 = vpsllq_avx(auVar15,0x3f);
  auVar23 = vpternlogq_avx512vl(auVar23,_auStack_78,auVar15,0x36);
  auVar17 = vpsrldq_avx(auVar19,8);
  *(undefined1 (*) [16])view = auVar23;
  auVar18 = vpsrlq_avx(auVar17,0x3f);
  auVar28 = vpslldq_avx(auVar19,8);
  *(undefined1 (*) [16])(view->t + 2) = auVar14 ^ auVar25;
  auVar15 = vpshldq_avx512_vbmi2(auVar19,auVar28,1);
  auVar16 = vpternlogq_avx512vl(auVar16,auVar18,*(undefined1 (*) [16])(mask_a->w64 + 2),0xa8);
  local_d8 = vpand_avx(auVar15,*(undefined1 (*) [16])mask_a->w64);
  local_c8 = vmovdqa64_avx512vl(auVar16);
  local_b8 = vpternlogq_avx512vl(local_1f8 ^ local_1d8,auVar24,auVar21,0x96);
  auVar24 = vpsrldq_avx(local_b8,8);
  auVar24 = vpshldq_avx512_vbmi2(auVar24,local_b8,0x3e);
  local_a8 = vpternlogq_avx512vl(local_1e8 ^ local_1c8,auVar22,auVar26,0x96);
  auVar22 = vpsrldq_avx(local_a8,8);
  auVar21 = vpslldq_avx(local_a8,8);
  auVar22 = vpshldq_avx512_vbmi2(auVar22,local_a8,0x3e);
  auVar21 = vpsllq_avx(auVar21,0x3e);
  auVar23 = vpternlogq_avx512vl(auVar24,auVar23,auVar21,0x36);
  auVar19 = vpshldq_avx512_vbmi2(auVar19,auVar28,2);
  auVar20 = vpshldq_avx512_vbmi2(auVar20,auVar27._0_16_,2);
  *(undefined1 (*) [16])view = auVar23;
  *(undefined1 (*) [16])(view->t + 2) = auVar22 ^ auVar14 ^ auVar25;
  auVar23 = vpsrlq_avx(auVar17,0x3e);
  local_98 = vpand_avx(auVar19,*(undefined1 (*) [16])mask_a->w64);
  local_88 = vpternlogq_avx512vl(auVar20,auVar23,*(undefined1 (*) [16])(mask_a->w64 + 2),0xa8);
  pauVar4 = &local_138;
  pauVar8 = &local_178;
  pauVar6 = &local_b8;
  pauVar10 = &local_f8;
  pauVar5 = &local_1b8;
  plVar13 = (longlong *)auStack_78;
  bVar3 = true;
  do {
    bVar7 = bVar3;
    uVar1 = *(ulong *)pauVar4[1];
    uVar2 = *(ulong *)(pauVar4[1] + 8);
    auVar19 = *(undefined1 (*) [16])plVar13;
    auVar20 = *(undefined1 (*) [16])(plVar13 + 2);
    auVar24._0_8_ = *(ulong *)*pauVar4 ^ *(ulong *)*pauVar10;
    auVar24._8_8_ = *(ulong *)(*pauVar4 + 8) ^ *(ulong *)(*pauVar10 + 8);
    auVar14._0_8_ = *(ulong *)*pauVar4 ^ *(ulong *)*pauVar8;
    auVar14._8_8_ = *(ulong *)(*pauVar4 + 8) ^ *(ulong *)(*pauVar8 + 8);
    auVar23 = *pauVar5;
    auVar25 = pauVar5[1];
    auVar26._0_8_ = auVar14._0_8_ ^ *(ulong *)*pauVar6;
    auVar26._8_8_ = auVar14._8_8_ ^ *(ulong *)(*pauVar6 + 8);
    *pauVar10 = auVar24;
    auVar22 = vpsrldq_avx(auVar24,8);
    auVar21._0_8_ = uVar1 ^ *(ulong *)pauVar10[1];
    auVar21._8_8_ = uVar2 ^ *(ulong *)(pauVar10[1] + 8);
    auVar15._0_8_ = uVar1 ^ *(ulong *)pauVar8[1];
    auVar15._8_8_ = uVar2 ^ *(ulong *)(pauVar8[1] + 8);
    *pauVar6 = auVar26;
    auVar17 = vpsrldq_avx(auVar26,8);
    auVar22 = vpshldq_avx512_vbmi2(auVar22,auVar24,0x3e);
    auVar16._0_8_ = auVar15._0_8_ ^ *(ulong *)pauVar6[1];
    auVar16._8_8_ = auVar15._8_8_ ^ *(ulong *)(pauVar6[1] + 8);
    auVar24 = vpshldq_avx512_vbmi2(auVar17,auVar26,0x3f);
    auVar17 = vpsrldq_avx(auVar21,8);
    auVar26 = vpslldq_avx(auVar21,8);
    pauVar10[1] = auVar21;
    auVar21 = vpshldq_avx512_vbmi2(auVar17,auVar21,0x3e);
    auVar18 = vpslldq_avx(auVar16,8);
    auVar28 = vpsrldq_avx(auVar16,8);
    pauVar6[1] = auVar16;
    auVar17 = vpsllq_avx(auVar26,0x3e);
    auVar26 = vpshldq_avx512_vbmi2(auVar28,auVar16,0x3f);
    auVar16 = vpsllq_avx(auVar18,0x3f);
    auVar24 = vpor_avx(auVar16,auVar24);
    auVar22 = vpternlogq_avx512vl(auVar22,auVar24,auVar17,0x36);
    pauVar8[1] = auVar26;
    *pauVar8 = auVar24;
    *pauVar4 = auVar22;
    auVar19 = vpternlogq_avx512vl(auVar22,auVar19 ^ auVar23,auVar14,0x96);
    auVar20 = vpternlogq_avx512vl(auVar20 ^ auVar25,auVar26 ^ auVar21,auVar15,0x96);
    pauVar4[1] = auVar26 ^ auVar21;
    *(undefined1 (*) [16])plVar13 = auVar19;
    *(undefined1 (*) [16])(plVar13 + 2) = auVar20;
    *(undefined1 (*) [16])out[lVar9].w64 = auVar19;
    *(undefined1 (*) [16])(out[lVar9].w64 + 2) = auVar20;
    lVar9 = 1;
    pauVar4 = &local_118;
    pauVar8 = &local_158;
    pauVar6 = &local_98;
    pauVar10 = &local_d8;
    pauVar5 = &local_198;
    plVar13 = r1s[0][1] + 1;
    bVar3 = false;
  } while (bVar7);
  return;
}

Assistant:

ATTR_TARGET_S128
static inline void mpc_sbox_verify_s128_256(mzd_local_t* out, const mzd_local_t* in, view_t* view,
                                            const rvec_t* rvec, const mzd_local_t* mask_a,
                                            const mzd_local_t* mask_b, const mzd_local_t* mask_c) {
  bitsliced_mm128_256_step_1(SC_VERIFY, mask_a, mask_b, mask_c);

  // a & b
  mpc_mm128_256_and_verify_def(NROLR, NROLR, r0m, x0s, x1s, r2m, mask_c, 0);
  // b & c
  mpc_mm128_256_and_verify_def(mm128_shift_left_256, mm128_shift_right_256, r2m, x1s, x2m, r1s,
                               mask_c, 1);
  // c & a
  mpc_mm128_256_and_verify_def(mm128_shift_left_256, mm128_shift_right_256, r1m, x0s, x2m, r0s,
                               mask_c, 2);

  bitsliced_mm128_256_step_2(SC_VERIFY);
}